

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O3

void google::protobuf::TestUtilLite::ModifyRepeatedFields(TestAllTypesLite *message)

{
  RepeatedField<int> *pRVar1;
  RepeatedField<long> *pRVar2;
  RepeatedField<unsigned_int> *pRVar3;
  RepeatedField<unsigned_long> *pRVar4;
  RepeatedField<float> *this;
  RepeatedField<double> *this_00;
  RepeatedField<bool> *this_01;
  bool bVar5;
  int iVar6;
  int *piVar7;
  long *plVar8;
  uint *puVar9;
  unsigned_long *puVar10;
  float *pfVar11;
  double *pdVar12;
  bool *pbVar13;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar14;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_RepeatedGroup>_>
  *pVVar15;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>_>
  *pVVar16;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessageLite>_>
  *pVVar17;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>_>
  *pVVar18;
  
  pRVar1 = &(message->field_0)._impl_.repeated_int32_;
  iVar6 = protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,
                     (undefined1  [824])
                     ((undefined1  [824])message->field_0 & (undefined1  [824])0x4) ==
                     (undefined1  [824])0x0);
  if (iVar6 < 2) {
    ModifyRepeatedFields();
LAB_00bc5013:
    ModifyRepeatedFields();
LAB_00bc501f:
    ModifyRepeatedFields();
LAB_00bc502b:
    ModifyRepeatedFields();
LAB_00bc5037:
    ModifyRepeatedFields();
LAB_00bc5043:
    ModifyRepeatedFields();
LAB_00bc504f:
    ModifyRepeatedFields();
LAB_00bc505b:
    ModifyRepeatedFields();
LAB_00bc5067:
    ModifyRepeatedFields();
LAB_00bc5073:
    ModifyRepeatedFields();
LAB_00bc507f:
    ModifyRepeatedFields();
LAB_00bc508b:
    ModifyRepeatedFields();
LAB_00bc5097:
    ModifyRepeatedFields();
LAB_00bc50a3:
    ModifyRepeatedFields();
LAB_00bc50af:
    ModifyRepeatedFields();
  }
  else {
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [824])
                               ((undefined1  [824])message->field_0 & (undefined1  [824])0x4) ==
                               (undefined1  [824])0x0);
    piVar7[1] = 0x1f5;
    pRVar2 = &(message->field_0)._impl_.repeated_int64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar2->soo_rep_,(*(byte *)((long)&message->field_0 + 0x20) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc5013;
    plVar8 = RepeatedField<long>::elements
                       (pRVar2,(*(byte *)((long)&message->field_0 + 0x20) & 4) == 0);
    plVar8[1] = 0x1f6;
    pRVar3 = &(message->field_0)._impl_.repeated_uint32_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar3->soo_rep_,(*(byte *)((long)&message->field_0 + 0x30) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc501f;
    puVar9 = RepeatedField<unsigned_int>::elements
                       (pRVar3,(*(byte *)((long)&message->field_0 + 0x30) & 4) == 0);
    puVar9[1] = 0x1f7;
    pRVar4 = &(message->field_0)._impl_.repeated_uint64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar4->soo_rep_,(*(byte *)((long)&message->field_0 + 0x40) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc502b;
    puVar10 = RepeatedField<unsigned_long>::elements
                        (pRVar4,(*(byte *)((long)&message->field_0 + 0x40) & 4) == 0);
    puVar10[1] = 0x1f8;
    pRVar1 = &(message->field_0)._impl_.repeated_sint32_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x50) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc5037;
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(*(byte *)((long)&message->field_0 + 0x50) & 4) == 0);
    piVar7[1] = 0x1f9;
    pRVar2 = &(message->field_0)._impl_.repeated_sint64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar2->soo_rep_,(*(byte *)((long)&message->field_0 + 0x60) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc5043;
    plVar8 = RepeatedField<long>::elements
                       (pRVar2,(*(byte *)((long)&message->field_0 + 0x60) & 4) == 0);
    plVar8[1] = 0x1fa;
    pRVar3 = &(message->field_0)._impl_.repeated_fixed32_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar3->soo_rep_,(*(byte *)((long)&message->field_0 + 0x70) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc504f;
    puVar9 = RepeatedField<unsigned_int>::elements
                       (pRVar3,(*(byte *)((long)&message->field_0 + 0x70) & 4) == 0);
    puVar9[1] = 0x1fb;
    pRVar4 = &(message->field_0)._impl_.repeated_fixed64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar4->soo_rep_,(*(byte *)((long)&message->field_0 + 0x80) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc505b;
    puVar10 = RepeatedField<unsigned_long>::elements
                        (pRVar4,(*(byte *)((long)&message->field_0 + 0x80) & 4) == 0);
    puVar10[1] = 0x1fc;
    pRVar1 = &(message->field_0)._impl_.repeated_sfixed32_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x90) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc5067;
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(*(byte *)((long)&message->field_0 + 0x90) & 4) == 0);
    piVar7[1] = 0x1fd;
    pRVar2 = &(message->field_0)._impl_.repeated_sfixed64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar2->soo_rep_,(*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc5073;
    plVar8 = RepeatedField<long>::elements
                       (pRVar2,(*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
    plVar8[1] = 0x1fe;
    this = &(message->field_0)._impl_.repeated_float_;
    iVar6 = protobuf::internal::SooRep::size
                      (&this->soo_rep_,(*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc507f;
    pfVar11 = RepeatedField<float>::elements
                        (this,(*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
    pfVar11[1] = 511.0;
    this_00 = &(message->field_0)._impl_.repeated_double_;
    iVar6 = protobuf::internal::SooRep::size
                      (&this_00->soo_rep_,(*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc508b;
    pdVar12 = RepeatedField<double>::elements
                        (this_00,(*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0);
    pdVar12[1] = 512.0;
    this_01 = &(message->field_0)._impl_.repeated_bool_;
    iVar6 = protobuf::internal::SooRep::size
                      (&this_01->soo_rep_,(*(byte *)((long)&message->field_0 + 0xd0) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc5097;
    pbVar13 = RepeatedField<bool>::elements
                        (this_01,(*(byte *)((long)&message->field_0 + 0xd0) & 4) == 0);
    pbVar13[1] = true;
    pVVar14 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        (&(message->field_0)._impl_.repeated_string_.super_RepeatedPtrFieldBase,1);
    std::__cxx11::string::_M_replace((ulong)pVVar14,0,(char *)pVVar14->_M_string_length,0x10f4711);
    pVVar14 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        (&(message->field_0)._impl_.repeated_bytes_.super_RepeatedPtrFieldBase,1);
    std::__cxx11::string::_M_replace((ulong)pVVar14,0,(char *)pVVar14->_M_string_length,0x10f4715);
    pVVar15 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_RepeatedGroup>>
                        (&(message->field_0)._impl_.repeatedgroup_.super_RepeatedPtrFieldBase,1);
    (pVVar15->field_0)._impl_.a_ = 0x205;
    *(byte *)&pVVar15->field_0 = *(byte *)&pVVar15->field_0 | 1;
    pVVar16 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                        (&(message->field_0)._impl_.repeated_nested_message_.
                          super_RepeatedPtrFieldBase,1);
    (pVVar16->field_0)._impl_.bb_ = 0x206;
    *(byte *)&pVVar16->field_0 = *(byte *)&pVVar16->field_0 | 2;
    pVVar17 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessageLite>>
                        (&(message->field_0)._impl_.repeated_foreign_message_.
                          super_RepeatedPtrFieldBase,1);
    (pVVar17->field_0)._impl_.c_ = 0x207;
    *(byte *)&pVVar17->field_0 = *(byte *)&pVVar17->field_0 | 1;
    pVVar18 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>>
                        (&(message->field_0)._impl_.repeated_import_message_.
                          super_RepeatedPtrFieldBase,1);
    (pVVar18->field_0)._impl_.d_ = 0x208;
    *(byte *)&pVVar18->field_0 = *(byte *)&pVVar18->field_0 | 1;
    pVVar16 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                        (&(message->field_0)._impl_.repeated_lazy_message_.
                          super_RepeatedPtrFieldBase,1);
    (pVVar16->field_0)._impl_.bb_ = 0x20f;
    *(byte *)&pVVar16->field_0 = *(byte *)&pVVar16->field_0 | 2;
    bVar5 = protobuf::internal::ValidateEnum
                      (1,(uint32_t *)&proto2_unittest::TestAllTypesLite_NestedEnum_internal_data_);
    if (!bVar5) goto LAB_00bc50c7;
    pRVar1 = &(message->field_0)._impl_.repeated_nested_enum_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x170) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc50a3;
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [16])
                               ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4
                               ) == (undefined1  [16])0x0);
    piVar7[1] = 1;
    bVar5 = protobuf::internal::ValidateEnum
                      (4,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_);
    if (!bVar5) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnumLite_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                    ,0x336b,
                    "void proto2_unittest::TestAllTypesLite::set_repeated_foreign_enum(int, ::proto2_unittest::ForeignEnumLite)"
                   );
    }
    pRVar1 = &(message->field_0)._impl_.repeated_foreign_enum_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x180) & 4) == 0);
    if (iVar6 < 2) goto LAB_00bc50af;
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [16])
                               ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4
                               ) == (undefined1  [16])0x0);
    piVar7[1] = 4;
    bVar5 = protobuf::internal::ValidateEnum
                      (7,(uint32_t *)&proto2_unittest_import::ImportEnumLite_internal_data_);
    if (!bVar5) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest_import::ImportEnumLite_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                    ,0x339f,
                    "void proto2_unittest::TestAllTypesLite::set_repeated_import_enum(int, ::proto2_unittest_import::ImportEnumLite)"
                   );
    }
    pRVar1 = &(message->field_0)._impl_.repeated_import_enum_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 400) & 4) == 0);
    if (1 < iVar6) {
      piVar7 = RepeatedField<int>::elements
                         (pRVar1,(undefined1  [16])
                                 ((undefined1  [16])(pRVar1->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
      piVar7[1] = 7;
      return;
    }
  }
  ModifyRepeatedFields();
LAB_00bc50c7:
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestAllTypesLite_NestedEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                ,0x3337,
                "void proto2_unittest::TestAllTypesLite::set_repeated_nested_enum(int, ::proto2_unittest::TestAllTypesLite_NestedEnum)"
               );
}

Assistant:

void TestUtilLite::ModifyRepeatedFields(unittest::TestAllTypesLite* message) {
  message->set_repeated_int32(1, 501);
  message->set_repeated_int64(1, 502);
  message->set_repeated_uint32(1, 503);
  message->set_repeated_uint64(1, 504);
  message->set_repeated_sint32(1, 505);
  message->set_repeated_sint64(1, 506);
  message->set_repeated_fixed32(1, 507);
  message->set_repeated_fixed64(1, 508);
  message->set_repeated_sfixed32(1, 509);
  message->set_repeated_sfixed64(1, 510);
  message->set_repeated_float(1, 511);
  message->set_repeated_double(1, 512);
  message->set_repeated_bool(1, true);
  message->set_repeated_string(1, "515");
  message->set_repeated_bytes(1, "516");

  message->mutable_repeatedgroup(1)->set_a(517);
  message->mutable_repeated_nested_message(1)->set_bb(518);
  message->mutable_repeated_foreign_message(1)->set_c(519);
  message->mutable_repeated_import_message(1)->set_d(520);
  message->mutable_repeated_lazy_message(1)->set_bb(527);

  message->set_repeated_nested_enum(1, unittest::TestAllTypesLite::FOO);
  message->set_repeated_foreign_enum(1, unittest::FOREIGN_LITE_FOO);
  message->set_repeated_import_enum(1, unittest_import::IMPORT_LITE_FOO);

}